

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall Catch::CompactReporter::noMatchingTestCases(CompactReporter *this,string *spec)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"No test cases matched \'",0x17);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(spec->_M_dataplus)._M_p,spec->_M_string_length);
  uStack_18 = CONCAT17(0x27,(undefined7)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 7),1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void CompactReporter::noMatchingTestCases( std::string const& spec ) {
            stream << "No test cases matched '" << spec << '\'' << std::endl;
        }